

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redexpress.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  string *psVar2;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  MidiFile midifile;
  Options options;
  MidiFile MStack_168;
  Options local_f8;
  
  smf::Options::Options(&local_f8);
  checkOptions(&local_f8,argc,argv);
  smf::MidiFile::MidiFile(&MStack_168);
  iVar1 = smf::Options::getArgCount(&local_f8);
  if (iVar1 < 1) {
    smf::MidiFile::read(&MStack_168,0x1352e0,__buf,in_RCX);
  }
  else {
    psVar2 = smf::Options::getArg_abi_cxx11_(&local_f8,1);
    smf::MidiFile::read(&MStack_168,(int)psVar2,__buf_00,in_RCX);
  }
  addExpression_T100(&MStack_168);
  iVar1 = smf::Options::getArgCount(&local_f8);
  if (iVar1 < 2) {
    operator<<((ostream *)&std::cout,&MStack_168);
  }
  else {
    psVar2 = smf::Options::getArg_abi_cxx11_(&local_f8,2);
    smf::MidiFile::write(&MStack_168,(int)psVar2,__buf_01,in_RCX);
  }
  smf::MidiFile::~MidiFile(&MStack_168);
  smf::Options::~Options(&local_f8);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
	Options options;
	checkOptions(options, argc, argv);
	MidiFile midifile;
	if (options.getArgCount() > 0) {
		midifile.read(options.getArg(1));
	} else {
		midifile.read(cin);
	}
	addExpression_T100(midifile);
	if (options.getArgCount() >= 2) {
		midifile.write(options.getArg(2));
	} else {
		cout << midifile;
	}

	return 0;
}